

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

void __thiscall TestSuite::~TestSuite(TestSuite *this)

{
  ulong uVar1;
  size_t sVar2;
  double dVar3;
  undefined1 auVar4 [16];
  string time_str;
  string local_38;
  
  auVar4 = std::chrono::_V2::system_clock::now();
  dVar3 = ((double)(auVar4._0_8_ - (this->startTimeGlobal).__d.__r) / 1000000000.0) * 1000000.0;
  uVar1 = (ulong)dVar3;
  usToString_abi_cxx11_
            (&local_38,
             (TestSuite *)((long)(dVar3 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1),
             auVar4._8_8_);
  sVar2 = 0;
  printf("\x1b[32m%zu\x1b[0m tests passed",this->cntPass);
  if (this->cntFail != 0) {
    printf(", \x1b[31m%zu\x1b[0m tests failed");
    sVar2 = this->cntFail;
  }
  printf(" out of \x1b[36m%zu\x1b[0m (\x1b[33m%s\x1b[0m)\n",sVar2 + this->cntPass,
         local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&this->filter);
  return;
}

Assistant:

~TestSuite() {
        std::chrono::time_point<std::chrono::system_clock> cur_time =
                std::chrono::system_clock::now();;
        std::chrono::duration<double> elapsed = cur_time - startTimeGlobal;
        std::string time_str = usToString
                               ( (uint64_t)(elapsed.count() * 1000000) );

        printf(_CL_GREEN("%zu") " tests passed", cntPass);
        if (cntFail) {
            printf(", " _CL_RED("%zu") " tests failed", cntFail);
        }
        printf(" out of " _CL_CYAN("%zu") " (" _CL_BROWN("%s") ")\n",
               cntPass+cntFail, time_str.c_str());
    }